

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMffc.c
# Opt level: O0

int Aig_NodeRef_rec(Aig_Obj_t *pNode,uint LevelMin)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  ulong uVar3;
  int local_2c;
  int Counter;
  Aig_Obj_t *pFanin;
  uint LevelMin_local;
  Aig_Obj_t *pNode_local;
  
  local_2c = 0;
  iVar1 = Aig_ObjIsCi(pNode);
  if (iVar1 == 0) {
    pAVar2 = Aig_ObjFanin0(pNode);
    uVar3 = *(ulong *)&pAVar2->field_0x18 >> 6;
    *(ulong *)&pAVar2->field_0x18 =
         *(ulong *)&pAVar2->field_0x18 & 0xffffffff0000003f |
         ((ulong)(((uint)uVar3 & 0x3ffffff) + 1) & 0x3ffffff) << 6;
    if (((uVar3 & 0x3ffffff) == 0) &&
       ((LevelMin == 0 ||
        (LevelMin < ((uint)((ulong)*(undefined8 *)&pAVar2->field_0x18 >> 0x20) & 0xffffff))))) {
      local_2c = Aig_NodeRef_rec(pAVar2,LevelMin);
    }
    iVar1 = Aig_ObjIsBuf(pNode);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsNode(pNode);
      if (iVar1 == 0) {
        __assert_fail("Aig_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigMffc.c"
                      ,99,"int Aig_NodeRef_rec(Aig_Obj_t *, unsigned int)");
      }
      pAVar2 = Aig_ObjFanin1(pNode);
      uVar3 = *(ulong *)&pAVar2->field_0x18 >> 6;
      *(ulong *)&pAVar2->field_0x18 =
           *(ulong *)&pAVar2->field_0x18 & 0xffffffff0000003f |
           ((ulong)(((uint)uVar3 & 0x3ffffff) + 1) & 0x3ffffff) << 6;
      if (((uVar3 & 0x3ffffff) == 0) &&
         ((LevelMin == 0 ||
          (LevelMin < ((uint)((ulong)*(undefined8 *)&pAVar2->field_0x18 >> 0x20) & 0xffffff))))) {
        iVar1 = Aig_NodeRef_rec(pAVar2,LevelMin);
        local_2c = iVar1 + local_2c;
      }
      pNode_local._4_4_ = local_2c + 1;
    }
    else {
      pNode_local._4_4_ = local_2c;
    }
  }
  else {
    pNode_local._4_4_ = 0;
  }
  return pNode_local._4_4_;
}

Assistant:

int Aig_NodeRef_rec( Aig_Obj_t * pNode, unsigned LevelMin )
{
    Aig_Obj_t * pFanin;
    int Counter = 0;
    if ( Aig_ObjIsCi(pNode) )
        return 0;
    // consider the first fanin
    pFanin = Aig_ObjFanin0(pNode);
    if ( pFanin->nRefs++ == 0 && (!LevelMin || pFanin->Level > LevelMin) )
        Counter += Aig_NodeRef_rec( pFanin, LevelMin );
    // skip the buffer
    if ( Aig_ObjIsBuf(pNode) )
        return Counter;
    assert( Aig_ObjIsNode(pNode) );
    // consider the second fanin
    pFanin = Aig_ObjFanin1(pNode);
    if ( pFanin->nRefs++ == 0 && (!LevelMin || pFanin->Level > LevelMin) )
        Counter += Aig_NodeRef_rec( pFanin, LevelMin );
    return Counter + 1;
}